

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::clear(hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        *this)

{
  bool bVar1;
  vector<crnlib::hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
  *in_RDI;
  
  bVar1 = vector<crnlib::hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
          ::empty(in_RDI);
  if (!bVar1) {
    vector<crnlib::hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
    ::clear_no_destruction(in_RDI);
    *(undefined4 *)&in_RDI[1].m_p = 0x20;
    in_RDI[1].m_size = 0;
    in_RDI[1].m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear() {
    if (!m_values.empty()) {
      if (CRNLIB_HAS_DESTRUCTOR(Key) || CRNLIB_HAS_DESTRUCTOR(Value)) {
        node* p = &get_node(0);
        node* p_end = p + m_values.size();

        uint num_remaining = m_num_valid;
        while (p != p_end) {
          if (p->state) {
            destruct_value_type(p);
            num_remaining--;
            if (!num_remaining)
              break;
          }

          p++;
        }
      }

      m_values.clear_no_destruction();

      m_hash_shift = 32;
      m_num_valid = 0;
      m_grow_threshold = 0;
    }
  }